

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_receive_unfragmented_frames_in_parts(void)

{
  uint length;
  cio_websocket_frame_type cVar1;
  frame_direction fVar2;
  cio_websocket *websocket;
  cio_error cVar3;
  void *__s;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong __size;
  ulong uVar7;
  long lVar8;
  ws_frame local_78;
  undefined4 local_58;
  frame_direction local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined2 local_40;
  
  lVar8 = 0;
  do {
    if (lVar8 == 7) {
      return;
    }
    length = (&DAT_00110f50)[lVar8];
    __size = (ulong)length;
    for (uVar4 = 0; uVar4 != 2; uVar4 = uVar4 + 1) {
      cVar1 = (&DAT_00110fe0)[uVar4];
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        cio_buffered_stream_read_at_most_fake.custom_fake = bs_read_at_most_from_buffer_parts;
        fVar2 = (&DAT_00110fe8)[lVar5];
        __s = malloc(__size);
        memset(__s,0x61,__size);
        local_78.last_frame = true;
        local_78.rsv = false;
        local_58 = 8;
        local_50 = 0;
        uStack_48 = 0;
        local_40 = 1;
        local_78.frame_type = cVar1;
        local_78.direction = fVar2;
        local_78.data = __s;
        local_78.data_length = __size;
        local_54 = fVar2;
        serialize_frames(&local_78,2);
        websocket = ws;
        *(ushort *)&(ws->ws_private).ws_flags =
             (SUB42((ws->ws_private).ws_flags,0) & 0xfbff | (ushort)((int)lVar5 << 10)) ^ 0x400;
        cVar3 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
        UnityAssertEqualNumber
                  (0,(long)cVar3,"Could not start reading a message!",0x2c4,UNITY_DISPLAY_STYLE_INT)
        ;
        UnityAssertGreaterOrLessOrEqualNumber
                  (2,(ulong)read_handler_fake.call_count,UNITY_GREATER_OR_EQUAL,
                   "read_handler was not called often enough",0x2c6,UNITY_DISPLAY_STYLE_INT);
        uVar7 = 0x32;
        if (read_handler_fake.arg_histories_dropped == 0) {
          UnityAssertEqualNumber
                    (1,(long)read_handler_fake.arg2_history[read_handler_fake.call_count - 1],
                     "read_handler wast not called with CIO_EOF",0x2ca,UNITY_DISPLAY_STYLE_INT);
          uVar7 = (ulong)(read_handler_fake.call_count - 1);
        }
        for (lVar6 = 0x8fc; lVar6 - uVar7 != 0x8fc; lVar6 = lVar6 + 1) {
          UnityAssertEqualNumber
                    ((UNITY_INT)ws,*(UNITY_INT *)(BYTE_ARRAY_001128ad + lVar6 * 8 + 0xb),
                     "websocket parameter of read_handler not correct",0x2d1,UNITY_DISPLAY_STYLE_INT
                    );
          if (*(long *)(BYTE_ARRAY_001129f9 + lVar6 * 8 + 0x57) != 0) {
            UnityFail("context of read handler not NULL",0x2d2);
          }
          UnityAssertEqualNumber
                    (0,(long)*(int *)(BYTE_ARRAY_00114f59 + lVar6 * 4 + 0x7b),
                     "error parameter of read_handler not CIO_SUCCESS",0x2d3,UNITY_DISPLAY_STYLE_INT
                    );
          UnityAssertGreaterOrLessOrEqualNumber
                    (__size,*(UNITY_INT *)(BYTE_ARRAY_00112c79 + lVar6 * 8 + 0x3f),
                     UNITY_SMALLER_OR_EQUAL,
                     "remaining length parameter of read_handler not less or equal to frame_size",
                     0x2d4,UNITY_DISPLAY_STYLE_INT);
          UnityAssertGreaterOrLessOrEqualNumber
                    (__size,*(UNITY_INT *)(BYTE_ARRAY_00112fb1 + lVar6 * 8 + 0x37),
                     UNITY_SMALLER_OR_EQUAL,
                     "chunk length parameter of read_handler not less or equal to frame_size",0x2d5,
                     UNITY_DISPLAY_STYLE_INT);
          if (*(char *)((long)read_handler_fake.arg0_history + lVar6 + -8) == '\0') {
            UnityFail("last_frame parameter of read_handler not true",0x2d6);
          }
          UnityAssertEqualNumber
                    (uVar4 & 0xffffffff ^ 1,
                     (ulong)*(byte *)((long)read_handler_fake.arg0_history + lVar6 + 0x2b),
                     "is_binary argument not not correct",0x2d7,UNITY_DISPLAY_STYLE_INT);
        }
        UnityAssertEqualNumber
                  (0,(ulong)on_error_fake.call_count,"error callback was called",0x2da,
                   UNITY_DISPLAY_STYLE_INT);
        if (lVar8 != 0) {
          UnityAssertEqualMemory
                    (__s,read_back_buffer,length,1,"data in read_handler not correct",0x2dc,
                     UNITY_ARRAY_TO_ARRAY);
        }
        UnityAssertEqualNumber
                  (1,(ulong)on_control_fake.call_count,
                   "control callback was not called for last close frame",0x2df,
                   UNITY_DISPLAY_STYLE_INT);
        if (on_control_fake.arg0_val == (cio_websocket *)0x0) {
          UnityFail("websocket parameter of control callback is NULL",0x2e0);
        }
        UnityAssertEqualNumber
                  (8,(ulong)on_control_fake.arg1_val,
                   "websocket parameter of control callback is NULL",0x2e1,UNITY_DISPLAY_STYLE_INT);
        if (on_control_fake.arg2_val != (uint8_t *)0x0) {
          UnityFail("data parameter of control callback is not correct",0x2e2);
        }
        UnityAssertEqualNumber
                  (0,(ulong)on_control_fake.arg3_val,
                   "data length parameter of control callback is not correct",0x2e3,
                   UNITY_DISPLAY_STYLE_INT);
        free(__s);
        free(ws);
        setUp();
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static void test_receive_unfragmented_frames_in_parts(void)
{
	uint32_t frame_sizes[] = {0, 1, 5, 125, 126, 65535, 65536};
	unsigned int frame_types[] = {CIO_WEBSOCKET_BINARY_FRAME, CIO_WEBSOCKET_TEXT_FRAME};
	enum frame_direction dirs[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int i = 0; i < ARRAY_SIZE(frame_sizes); i++) {
		for (unsigned int j = 0; j < ARRAY_SIZE(frame_types); j++) {
			for (unsigned int k = 0; k < ARRAY_SIZE(dirs); k++) {
				cio_buffered_stream_read_at_most_fake.custom_fake = bs_read_at_most_from_buffer_parts;
				uint32_t frame_size = frame_sizes[i];
				unsigned int frame_type = frame_types[j];
				enum frame_direction dir = dirs[k];

				char *data = malloc(frame_size);
				memset(data, 'a', frame_size);
				struct ws_frame frames[] = {
				    {.frame_type = frame_type, .direction = dir, .data = data, .data_length = frame_size, .last_frame = true, .rsv = false},
				    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = dir, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
				};

				serialize_frames(frames, ARRAY_SIZE(frames));

				ws->ws_private.ws_flags.is_server = (dir == FROM_CLIENT) ? 1 : 0;
				enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
				TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

				TEST_ASSERT_GREATER_OR_EQUAL_MESSAGE(2, read_handler_fake.call_count, "read_handler was not called often enough");

				unsigned int data_frame_call_count;
				if (read_handler_fake.arg_histories_dropped == 0) {
					TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[read_handler_fake.call_count - 1], "read_handler wast not called with CIO_EOF");
					data_frame_call_count = read_handler_fake.call_count - 1;
				} else {
					data_frame_call_count = FFF_ARG_HISTORY_LEN;
				}

				for (unsigned int l = 0; l < data_frame_call_count; l++) {
					TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_history[l], "websocket parameter of read_handler not correct");
					TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[l], "context of read handler not NULL");
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, read_handler_fake.arg2_history[l], "error parameter of read_handler not CIO_SUCCESS");
					TEST_ASSERT_LESS_OR_EQUAL_MESSAGE(frame_size, read_handler_fake.arg3_history[l], "remaining length parameter of read_handler not less or equal to frame_size");
					TEST_ASSERT_LESS_OR_EQUAL_MESSAGE(frame_size, read_handler_fake.arg5_history[l], "chunk length parameter of read_handler not less or equal to frame_size");
					TEST_ASSERT_TRUE_MESSAGE(read_handler_fake.arg7_history[l], "last_frame parameter of read_handler not true");
					TEST_ASSERT_EQUAL_MESSAGE(frame_type == CIO_WEBSOCKET_BINARY_FRAME, read_handler_fake.arg8_history[l], "is_binary argument not not correct");
				}

				TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
				if (frame_size > 0) {
					TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, read_back_buffer, frame_size, "data in read_handler not correct");
				}

				TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was not called for last close frame");
				TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_val, "websocket parameter of control callback is NULL");
				TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_val, "websocket parameter of control callback is NULL");
				TEST_ASSERT_NULL_MESSAGE(on_control_fake.arg2_val, "data parameter of control callback is not correct");
				TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.arg3_val, "data length parameter of control callback is not correct");

				if (data) {
					free(data);
				}

				free(ws);
				setUp();
			}
		}
	}
}